

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIf(AsmJSByteCodeGenerator *this,ParseNodeIf *pnode)

{
  AsmJsByteCodeWriter *this_00;
  AsmJsFunc *pAVar1;
  ParseNodeIf *pPVar2;
  ByteCodeLabel BVar3;
  Types type;
  EmitExpressionInfo EVar4;
  RegisterSpace *this_01;
  EmitExpressionInfo local_50;
  EmitExpressionInfo local_48;
  ParseNodeIf *local_40;
  ByteCodeLabel local_34;
  
  this_00 = &this->mWriter;
  BVar3 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_34 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_40 = pnode;
  EVar4 = EmitBooleanExpression(this,pnode->pnodeCond,BVar3,local_34);
  pAVar1 = this->mFunction;
  type = WAsmJs::FromPrimitiveType<int>();
  this_01 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,type);
  if (EVar4.super_EmitInfoBase.location.location != 0xffffffff) {
    WAsmJs::RegisterSpace::ReleaseTmpRegister(this_01,EVar4.super_EmitInfoBase.location.location);
  }
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,BVar3);
  pPVar2 = local_40;
  local_50 = Emit(this,local_40->pnodeTrue);
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_50);
  BVar3 = local_34;
  if (pPVar2->pnodeFalse != (ParseNodePtr)0x0) {
    BVar3 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
    ByteCodeWriter::RecordStatementAdjustment(&this_00->super_ByteCodeWriter,SAT_FromCurrentToNext);
    AsmJsByteCodeWriter::AsmBr(this_00,BVar3,AsmBr);
    AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,local_34);
    local_48 = Emit(this,pPVar2->pnodeFalse);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_48);
  }
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,BVar3);
  if ((pPVar2->super_ParseNodeStmt).emitLabels == true) {
    AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(pPVar2->super_ParseNodeStmt).breakLabel);
  }
  EVar4.super_EmitInfoBase.location = 0xffffffff;
  EVar4.type.which_ = Void;
  return EVar4;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitIf( ParseNodeIf * pnode )
    {
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->pnodeCond, trueLabel, falseLabel );
        mFunction->ReleaseLocation<int>( &boolInfo );


        mWriter.MarkAsmJsLabel( trueLabel );

        const EmitExpressionInfo& trueInfo = Emit( pnode->pnodeTrue );
        mFunction->ReleaseLocationGeneric( &trueInfo );

        if( pnode->pnodeFalse != nullptr )
        {
            // has else clause
            Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();

            // Record the branch bytecode offset
            mWriter.RecordStatementAdjustment( Js::FunctionBody::SAT_FromCurrentToNext );

            // then clause skips else clause
            mWriter.AsmBr( skipLabel );
            // generate code for else clause
            mWriter.MarkAsmJsLabel( falseLabel );

            const EmitExpressionInfo& falseInfo = Emit( pnode->pnodeFalse );
            mFunction->ReleaseLocationGeneric( &falseInfo );

            mWriter.MarkAsmJsLabel( skipLabel );

        }
        else
        {
            mWriter.MarkAsmJsLabel( falseLabel );
        }
        if( pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }
        return EmitExpressionInfo( AsmJsType::Void );
    }